

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  Type *this_00;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  
  sVar6 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    sVar7 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
    sVar6 = sVar6 + sVar7;
  }
  uVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar6 = sVar6 + (ulong)uVar5 * 2;
  if ((ulong)uVar5 != 0) {
    uVar10 = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,uVar10);
      sVar7 = UninterpretedOption::ByteSizeLong(this_00);
      uVar4 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->java_package_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar2 = ((this->java_outer_classname_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 4) != 0) {
      sVar2 = ((this->go_package_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 8) != 0) {
      sVar2 = ((this->objc_class_prefix_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 & 0x10) != 0) {
      sVar2 = ((this->csharp_namespace_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 & 0x20) != 0) {
      sVar2 = ((this->swift_prefix_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar5 & 0x40) != 0) {
      sVar2 = ((this->php_class_prefix_).ptr_)->_M_string_length;
      uVar10 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    sVar6 = sVar6 + (uVar5 >> 6 & 2);
  }
  if ((uVar5 & 0xff00) != 0) {
    sVar7 = sVar6 + 3;
    if ((uVar5 >> 8 & 1) == 0) {
      sVar7 = sVar6;
    }
    sVar6 = sVar7 + 3;
    if ((uVar5 >> 9 & 1) == 0) {
      sVar6 = sVar7;
    }
    sVar7 = sVar6 + 3;
    if ((uVar5 >> 10 & 1) == 0) {
      sVar7 = sVar6;
    }
    sVar6 = sVar7 + 3;
    if ((uVar5 >> 0xb & 1) == 0) {
      sVar6 = sVar7;
    }
    sVar7 = sVar6 + 3;
    if ((uVar5 >> 0xc & 1) == 0) {
      sVar7 = sVar6;
    }
    sVar9 = sVar7 + 3;
    if ((uVar5 >> 0xd & 1) == 0) {
      sVar9 = sVar7;
    }
    sVar6 = sVar9 + 3;
    if ((uVar5 >> 0xe & 1) == 0) {
      sVar6 = sVar9;
    }
    if ((short)uVar5 < 0) {
      if (this->optimize_for_ < 0) {
        uVar8 = 0xb;
      }
      else {
        uVar5 = this->optimize_for_ | 1;
        iVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar6 = sVar6 + uVar8;
    }
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t FileOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional string objc_class_prefix = 36;
    if (has_objc_class_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->objc_class_prefix());
    }

    // optional string csharp_namespace = 37;
    if (has_csharp_namespace()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->csharp_namespace());
    }

    // optional string swift_prefix = 39;
    if (has_swift_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->swift_prefix());
    }

    // optional string php_class_prefix = 40;
    if (has_php_class_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->php_class_prefix());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional bool java_string_check_utf8 = 27 [default = false];
    if (has_java_string_check_utf8()) {
      total_size += 2 + 1;
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool deprecated = 23 [default = false];
    if (has_deprecated()) {
      total_size += 2 + 1;
    }

    // optional bool cc_enable_arenas = 31 [default = false];
    if (has_cc_enable_arenas()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}